

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O2

void __thiscall
TPZCompElDisc::Shape
          (TPZCompElDisc *this,TPZVec<double> *qsi,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZGeoEl *pTVar1;
  TPZManVector<double,_4> x;
  
  if (this->fUseQsiEta == true) {
    (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
              (this,qsi,phi,dphi);
    return;
  }
  TPZManVector<double,_4>::TPZManVector(&x,3);
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,qsi,&x);
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
            (this,&x,phi,dphi);
  TPZManVector<double,_4>::~TPZManVector(&x);
  return;
}

Assistant:

void TPZCompElDisc::Shape(TPZVec<REAL> &qsi,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
    if(fUseQsiEta==true){
        this->ShapeX(qsi,phi,dphi);
    }else{

        TPZManVector<REAL,4> x(3);
        this->Reference()->X(qsi,x);
        this->ShapeX(x,phi,dphi);
    }
}